

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepFrameBuffer.cpp
# Opt level: O0

DeepSlice * __thiscall Imf_3_4::DeepFrameBuffer::operator[](DeepFrameBuffer *this,char *name)

{
  bool bVar1;
  ostream *poVar2;
  ArgExc *this_00;
  pointer ppVar3;
  char *in_RSI;
  stringstream _iex_throw_s;
  const_iterator i;
  map<Imf_3_4::Name,_Imf_3_4::DeepSlice,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  *in_stack_fffffffffffffd28;
  Name *in_stack_fffffffffffffd30;
  stringstream local_2a8 [16];
  ostream local_298 [376];
  _Self local_120 [33];
  _Self local_18;
  char *local_10;
  
  local_10 = in_RSI;
  Name::Name(in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<Imf_3_4::Name,_Imf_3_4::DeepSlice,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
       ::find(in_stack_fffffffffffffd28,(key_type *)0x1a2c1b);
  local_120[0]._M_node =
       (_Base_ptr)
       std::
       map<Imf_3_4::Name,_Imf_3_4::DeepSlice,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
       ::end(in_stack_fffffffffffffd28);
  bVar1 = std::operator==(&local_18,local_120);
  if (!bVar1) {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>
                         *)in_stack_fffffffffffffd30);
    return &ppVar3->second;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_2a8);
  poVar2 = std::operator<<(local_298,"Cannot find frame buffer slice \"");
  poVar2 = std::operator<<(poVar2,local_10);
  std::operator<<(poVar2,"\".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,local_2a8);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

const DeepSlice&
DeepFrameBuffer::operator[] (const char name[]) const
{
    SliceMap::const_iterator i = _map.find (name);

    if (i == _map.end ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot find frame buffer slice \"" << name << "\".");
    }

    return i->second;
}